

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 65816Storage.cpp
# Opt level: O3

void CPU::WDC65816::ProcessorStorageConstructor::stack_phd
               (AccessType param_1,bool param_2,function<void_(CPU::WDC65816::MicroOp)> *target)

{
  MicroOp local_c [4];
  
  local_c[0] = CycleFetchPCThrowaway;
  if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*target->_M_invoker)((_Any_data *)target,local_c);
    local_c[1] = 0x2e;
    if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
      (*target->_M_invoker)((_Any_data *)target,local_c + 1);
      local_c[2] = 0x17;
      if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
        (*target->_M_invoker)((_Any_data *)target,local_c + 2);
        local_c[3] = 0x17;
        if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
          (*target->_M_invoker)((_Any_data *)target,local_c + 3);
          return;
        }
      }
    }
  }
  std::__throw_bad_function_call();
}

Assistant:

static void stack_phd(AccessType, bool, const std::function<void(MicroOp)> &target) {
		target(CycleFetchPCThrowaway);	// IO.

		target(OperationPerform);

		target(CyclePushNotEmulation);	// REG high.
		target(CyclePushNotEmulation);	// REG [low].
	}